

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatcc_json_parser.h
# Opt level: O1

char * flatcc_json_parser_space(flatcc_json_parser_t *ctx,char *buf,char *end)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  ulong uVar4;
  
  if (1 < (long)end - (long)buf) {
    if (*buf < '!') {
      if ((*buf != ' ') || (buf[1] < '!')) goto LAB_00108715;
      buf = buf + 1;
    }
    return buf;
  }
LAB_00108715:
  do {
    pbVar1 = (byte *)buf;
    pbVar3 = (byte *)buf;
    if (0xf < (long)end - (long)buf) {
      if (' ' < *buf) {
        return (char *)(byte *)buf;
      }
      uVar4 = (ulong)(*(short *)buf == 0x2020);
      pbVar1 = (byte *)buf + (ulong)(((byte *)buf)[uVar4 * 2] == 0x20) + uVar4 * 2;
      pbVar3 = pbVar1;
      if (' ' < (char)((byte *)buf)[(ulong)(((byte *)buf)[uVar4 * 2] == 0x20) + uVar4 * 2]) {
        return (char *)pbVar1;
      }
    }
    for (; (buf = (char *)pbVar3, pbVar1 != (byte *)end && (buf = (char *)pbVar1, *pbVar1 == 0x20));
        pbVar1 = pbVar1 + 1) {
      pbVar3 = (byte *)end;
    }
    while( true ) {
      while( true ) {
        if (buf == end) {
          return (char *)(byte *)buf;
        }
        bVar2 = *buf;
        if (' ' < (char)bVar2) {
          return (char *)(byte *)buf;
        }
        if (0xc < bVar2) break;
        if (bVar2 != 9) {
          if (bVar2 == 10) {
            ctx->line = ctx->line + 1;
            goto LAB_001087b7;
          }
          goto LAB_001087c6;
        }
        buf = (char *)((byte *)buf + 1);
      }
      if (bVar2 != 0xd) break;
      if ((long)end - (long)buf < 2) {
        uVar4 = 0;
      }
      else {
        uVar4 = (ulong)(((byte *)buf)[1] == 10);
      }
      ctx->line = ctx->line + 1;
      buf = (char *)((byte *)buf + uVar4);
LAB_001087b7:
      buf = (char *)((byte *)buf + 1);
      ctx->line_start = buf;
    }
    if (bVar2 != 0x20) {
LAB_001087c6:
      if (ctx->error == 0) {
        ctx->error = 5;
        ctx->pos = ((int)buf - *(int *)&ctx->line_start) + 1;
        ctx->error_loc = buf;
      }
      return end;
    }
  } while( true );
}

Assistant:

static inline const char *flatcc_json_parser_space(flatcc_json_parser_t *ctx, const char *buf, const char *end)
{
    if (end - buf > 1) {
        if (buf[0] > 0x20) {
            return buf;
        }
        if (buf[0] == 0x20 && buf[1] > 0x20) {
            return buf + 1;
        }
    }
    return flatcc_json_parser_space_ext(ctx, buf, end);
}